

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Expr> __thiscall Parser::join(Parser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar2;
  undefined1 local_60 [48];
  undefined1 local_30 [8];
  shared_ptr<Token> tok;
  Parser *this_local;
  shared_ptr<Expr> *x;
  
  tok.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  equality(this);
  while (peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )&in_RSI->look), peVar1->tag == 0x100) {
    std::shared_ptr<Token>::shared_ptr((shared_ptr<Token> *)local_30,&in_RSI->look);
    move(in_RSI);
    equality((Parser *)local_60);
    std::make_shared<And,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)(local_60 + 0x10),(shared_ptr<Expr> *)local_30,
               (shared_ptr<Expr> *)this);
    std::shared_ptr<Expr>::operator=((shared_ptr<Expr> *)this,(shared_ptr<And> *)(local_60 + 0x10));
    std::shared_ptr<And>::~shared_ptr((shared_ptr<And> *)(local_60 + 0x10));
    std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)local_60);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  }
  sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> join() {
		std::shared_ptr<Expr> x = equality();
		while (look->tag == AND) {
			std::shared_ptr<Token> tok = look; move();
			x = std::make_shared<And>(tok, x, equality());
		}
		return x;
	}